

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O0

void __thiscall leveldb::Harness::Add(Harness *this,string *key,string *value)

{
  Constructor *this_00;
  Slice local_30;
  string *local_20;
  string *value_local;
  string *key_local;
  Harness *this_local;
  
  this_00 = this->constructor_;
  local_20 = value;
  value_local = key;
  key_local = (string *)this;
  Slice::Slice(&local_30,value);
  Constructor::Add(this_00,key,&local_30);
  return;
}

Assistant:

void Add(const std::string& key, const std::string& value) {
    constructor_->Add(key, value);
  }